

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo2.cpp
# Opt level: O0

int64_t primecount::pi_lmo2(int64_t x)

{
  undefined1 x_00 [16];
  long lVar1;
  Vector<int,_std::allocator<int>_> *this;
  Vector<int,_std::allocator<int>_> *mu_00;
  size_t sVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  long in_RDI;
  double dVar6;
  int64_t sum;
  int64_t phi;
  int64_t s2;
  int64_t s1;
  int64_t p2;
  int64_t pi_y;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  type primes;
  int64_t c;
  int64_t y;
  int64_t x13;
  double alpha;
  int threads;
  uint64_t in_stack_fffffffffffffec8;
  long in_stack_fffffffffffffee0;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 is_print;
  int in_stack_ffffffffffffff2c;
  int64_t in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  int64_t in_stack_ffffffffffffff40;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  long local_8;
  
  if (in_RDI < 2) {
    local_8 = 0;
  }
  else {
    x_00._4_4_ = in_stack_ffffffffffffff24;
    x_00._0_4_ = in_stack_ffffffffffffff20;
    x_00._8_4_ = in_stack_ffffffffffffff28;
    x_00._12_4_ = in_stack_ffffffffffffff2c;
    dVar6 = get_alpha_lmo((maxint_t)x_00);
    lVar1 = (anonymous_namespace)::iroot<3,long>(in_stack_fffffffffffffee0);
    this = (Vector<int,_std::allocator<int>_> *)(long)((double)lVar1 * dVar6);
    mu_00 = (Vector<int,_std::allocator<int>_> *)PhiTiny::get_c(in_stack_fffffffffffffec8);
    generate_primes<int>(in_stack_fffffffffffffec8);
    generate_lpf(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    generate_moebius(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    is_print = (undefined1)((uint)in_stack_ffffffffffffff28 >> 0x18);
    sVar2 = Vector<int,_std::allocator<int>_>::size
                      ((Vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff98);
    primecount::is_print();
    iVar3 = P2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c,(bool)is_print);
    primecount::is_print();
    iVar4 = S1(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c,(bool)is_print);
    iVar5 = anon_unknown.dwarf_6be5e::S2
                      ((int64_t)in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98,
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
                       ,in_stack_ffffffffffffff78,mu_00);
    local_8 = (iVar4 + iVar5 + sVar2 + -2) - iVar3;
    Vector<int,_std::allocator<int>_>::~Vector(this);
    Vector<int,_std::allocator<int>_>::~Vector(this);
    Vector<int,_std::allocator<int>_>::~Vector(this);
  }
  return local_8;
}

Assistant:

int64_t pi_lmo2(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}